

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_bool mVar1;
  mz_bool static_block_local;
  tdefl_compressor *d_local;
  
  if (static_block == 0) {
    tdefl_start_dynamic_block(d);
  }
  else {
    tdefl_start_static_block(d);
  }
  mVar1 = tdefl_compress_lz_codes(d);
  return mVar1;
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}